

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O0

int rtr_send_error_pdu_from_host
              (rtr_socket *rtr_socket,void *erroneous_pdu,uint32_t erroneous_pdu_len,
              pdu_error_type error,char *err_text,uint32_t err_text_len)

{
  long lVar1;
  undefined1 *puVar2;
  uint32_t err_text_len_00;
  char *err_text_00;
  pdu_error_type error_00;
  uint32_t erroneous_pdu_len_00;
  void *rtr_socket_00;
  long in_FS_OFFSET;
  undefined8 uStack_70;
  undefined1 auStack_68 [4];
  int local_64;
  undefined1 *local_60;
  undefined4 local_54;
  ulong local_50;
  unsigned_long __vla_expr0;
  uint32_t local_3c;
  char *pcStack_38;
  uint32_t err_text_len_local;
  char *err_text_local;
  pdu_error_type error_local;
  uint32_t erroneous_pdu_len_local;
  void *erroneous_pdu_local;
  rtr_socket *rtr_socket_local;
  long local_10;
  
  __vla_expr0 = (unsigned_long)auStack_68;
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = (ulong)erroneous_pdu_len;
  lVar1 = -(local_50 + 0xf & 0xfffffffffffffff0);
  local_60 = auStack_68 + lVar1;
  local_3c = err_text_len;
  pcStack_38 = err_text;
  err_text_local._0_4_ = error;
  err_text_local._4_4_ = erroneous_pdu_len;
  _error_local = erroneous_pdu;
  erroneous_pdu_local = rtr_socket;
  *(undefined8 *)((long)&uStack_70 + lVar1) = 0x10e25f;
  memcpy(auStack_68 + lVar1,erroneous_pdu,(ulong)erroneous_pdu_len);
  puVar2 = local_60;
  if (err_text_local._4_4_ == 8) {
    *(undefined8 *)((long)&uStack_70 + lVar1) = 0x10e271;
    rtr_pdu_header_to_network_byte_order(puVar2);
  }
  else {
    if (err_text_local._4_4_ < 9) {
      rtr_socket_local._4_4_ = -1;
      goto LAB_0010e2be;
    }
    *(undefined8 *)((long)&uStack_70 + lVar1) = 0x10e285;
    rtr_pdu_to_network_byte_order(puVar2);
  }
  rtr_socket_00 = erroneous_pdu_local;
  erroneous_pdu_len_00 = err_text_local._4_4_;
  error_00 = (pdu_error_type)err_text_local;
  err_text_00 = pcStack_38;
  err_text_len_00 = local_3c;
  puVar2 = local_60;
  *(undefined8 *)((long)&uStack_70 + lVar1) = 0x10e2b4;
  rtr_socket_local._4_4_ =
       rtr_send_error_pdu((rtr_socket *)rtr_socket_00,puVar2,erroneous_pdu_len_00,error_00,
                          err_text_00,err_text_len_00);
LAB_0010e2be:
  local_54 = 1;
  local_64 = rtr_socket_local._4_4_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return rtr_socket_local._4_4_;
  }
  *(undefined8 *)(__vla_expr0 - 8) = 0x10e2ea;
  __stack_chk_fail();
}

Assistant:

static int rtr_send_error_pdu_from_host(const struct rtr_socket *rtr_socket, const void *erroneous_pdu,
					const uint32_t erroneous_pdu_len, const enum pdu_error_type error,
					const char *err_text, const uint32_t err_text_len)
{
	char pdu[erroneous_pdu_len];

	memcpy(&pdu, erroneous_pdu, erroneous_pdu_len);

	if (erroneous_pdu_len == sizeof(struct pdu_header))
		rtr_pdu_header_to_network_byte_order(&pdu);
	else if (erroneous_pdu_len > sizeof(struct pdu_header))
		rtr_pdu_to_network_byte_order(&pdu);
	else
		return RTR_ERROR;

	return rtr_send_error_pdu(rtr_socket, &pdu, erroneous_pdu_len, error, err_text, err_text_len);
}